

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O3

void proto2_unittest::TestParsingMergeLite::SharedDtor(MessageLite *self)

{
  MessageLite *pMVar1;
  TestParsingMergeLite_OptionalGroup *this;
  ulong uVar2;
  undefined8 extraout_RAX;
  
  uVar2 = (self->_internal_metadata_).ptr_;
  if ((uVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DeleteOutOfLineHelper<std::__cxx11::string>
              (&self->_internal_metadata_);
    uVar2 = (self->_internal_metadata_).ptr_;
  }
  if ((uVar2 & 1) != 0) {
    uVar2 = *(ulong *)(uVar2 & 0xfffffffffffffffe);
  }
  if (uVar2 == 0) {
    pMVar1 = (MessageLite *)self[6]._vptr_MessageLite;
    if (pMVar1 != (MessageLite *)0x0) {
      TestAllTypesLite::SharedDtor(pMVar1);
    }
    operator_delete(pMVar1,0x348);
    pMVar1 = (MessageLite *)self[6]._internal_metadata_.ptr_;
    if (pMVar1 != (MessageLite *)0x0) {
      TestAllTypesLite::SharedDtor(pMVar1);
    }
    operator_delete(pMVar1,0x348);
    this = (TestParsingMergeLite_OptionalGroup *)self[7]._vptr_MessageLite;
    if (this != (TestParsingMergeLite_OptionalGroup *)0x0) {
      TestParsingMergeLite_OptionalGroup::~TestParsingMergeLite_OptionalGroup(this);
    }
    operator_delete(this,0x20);
    google::protobuf::RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedGroup>::
    ~RepeatedPtrField((RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedGroup> *)
                      &self[4]._internal_metadata_);
    google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::~RepeatedPtrField
              ((RepeatedPtrField<proto2_unittest::TestAllTypesLite> *)(self + 3));
    google::protobuf::internal::ExtensionSet::~ExtensionSet((ExtensionSet *)(self + 1));
    return;
  }
  SharedDtor((TestParsingMergeLite *)&stack0xffffffffffffffd8);
  __clang_call_terminate(extraout_RAX);
}

Assistant:

inline void TestParsingMergeLite::SharedDtor(MessageLite& self) {
  TestParsingMergeLite& this_ = static_cast<TestParsingMergeLite&>(self);
  this_._internal_metadata_.Delete<std::string>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  delete this_._impl_.required_all_types_;
  delete this_._impl_.optional_all_types_;
  delete this_._impl_.optionalgroup_;
  this_._impl_.~Impl_();
}